

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

SPIRExpression * __thiscall
diligent_spirv_cross::CompilerGLSL::emit_uninitialized_temporary_expression
          (CompilerGLSL *this,uint32_t type,uint32_t id)

{
  undefined4 id_00;
  SPIRExpression *pSVar1;
  undefined4 in_register_00000014;
  bool local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *local_28;
  undefined1 local_18 [8];
  uint32_t id_local;
  uint32_t type_local;
  CompilerGLSL *this_local;
  
  local_18._0_4_ = id;
  local_18._4_4_ = type;
  _id_local = this;
  local_28 = ::std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                      &(this->super_Compiler).forced_temporaries,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)local_18,(value_type *)CONCAT44(in_register_00000014,id));
  emit_uninitialized_temporary(this,local_18._4_4_,local_18._0_4_);
  id_00 = local_18._0_4_;
  (*(this->super_Compiler)._vptr_Compiler[6])();
  local_49 = true;
  pSVar1 = Compiler::
           set<diligent_spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                     (&this->super_Compiler,id_00,&local_48,(uint *)(local_18 + 4),&local_49);
  ::std::__cxx11::string::~string((string *)&local_48);
  return pSVar1;
}

Assistant:

SPIRExpression &CompilerGLSL::emit_uninitialized_temporary_expression(uint32_t type, uint32_t id)
{
	forced_temporaries.insert(id);
	emit_uninitialized_temporary(type, id);
	return set<SPIRExpression>(id, to_name(id), type, true);
}